

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

shared_ptr<CommodoreGCRParser::Sector> __thiscall
CommodoreGCRParser::get_next_sector(CommodoreGCRParser *this)

{
  byte bVar1;
  uint8_t uVar2;
  int max_index_count_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  element_type *peVar6;
  reference pvVar7;
  byte *pbVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CommodoreGCRParser *in_RSI;
  shared_ptr<CommodoreGCRParser::Sector> sVar9;
  ulong uStack_50;
  uint16_t sector_address;
  size_t c;
  uint8_t disk_id [2];
  uint8_t checksum;
  undefined1 local_28 [4];
  int max_index_count;
  shared_ptr<CommodoreGCRParser::Sector> sector;
  CommodoreGCRParser *this_local;
  
  std::make_shared<CommodoreGCRParser::Sector>();
  max_index_count_00 = in_RSI->index_count_ + 2;
  do {
    do {
      if (max_index_count_00 <= in_RSI->index_count_) {
        std::shared_ptr<CommodoreGCRParser::Sector>::shared_ptr
                  ((shared_ptr<CommodoreGCRParser::Sector> *)this,(nullptr_t)0x0);
        goto LAB_0019dfd1;
      }
      while (uVar3 = proceed_to_next_block(in_RSI,max_index_count_00), uVar3 != 8) {
        if (max_index_count_00 <= in_RSI->index_count_) {
          std::shared_ptr<CommodoreGCRParser::Sector>::shared_ptr
                    ((shared_ptr<CommodoreGCRParser::Sector> *)this,(nullptr_t)0x0);
          goto LAB_0019dfd1;
        }
      }
      uVar3 = get_next_byte(in_RSI);
      uVar4 = get_next_byte(in_RSI);
      peVar6 = std::
               __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      peVar6->sector = (uint8_t)uVar4;
      uVar4 = get_next_byte(in_RSI);
      peVar6 = std::
               __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      peVar6->track = (uint8_t)uVar4;
      uVar4 = get_next_byte(in_RSI);
      uVar5 = get_next_byte(in_RSI);
      peVar6 = std::
               __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      bVar1 = peVar6->sector;
      peVar6 = std::
               __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
    } while ((uVar3 & 0xff) != (uint)(byte)(bVar1 ^ peVar6->track ^ (byte)uVar4 ^ (byte)uVar5));
    while (uVar3 = proceed_to_next_block(in_RSI,max_index_count_00), uVar3 != 7) {
      if (max_index_count_00 <= in_RSI->index_count_) {
        std::shared_ptr<CommodoreGCRParser::Sector>::shared_ptr
                  ((shared_ptr<CommodoreGCRParser::Sector> *)this,(nullptr_t)0x0);
        goto LAB_0019dfd1;
      }
    }
    c._7_1_ = 0;
    for (uStack_50 = 0; uStack_50 < 0x100; uStack_50 = uStack_50 + 1) {
      uVar3 = get_next_byte(in_RSI);
      peVar6 = std::
               __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      pvVar7 = std::array<unsigned_char,_256UL>::operator[](&peVar6->data,uStack_50);
      *pvVar7 = (value_type_conflict3)uVar3;
      peVar6 = std::
               __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      pbVar8 = std::array<unsigned_char,_256UL>::operator[](&peVar6->data,uStack_50);
      c._7_1_ = c._7_1_ ^ *pbVar8;
    }
    uVar3 = get_next_byte(in_RSI);
  } while (c._7_1_ != uVar3);
  peVar6 = std::
           __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  uVar2 = peVar6->track;
  peVar6 = std::
           __shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::shared_ptr<CommodoreGCRParser::Sector>::operator=
            (in_RSI->sector_cache_ + CONCAT11(uVar2,peVar6->sector),
             (shared_ptr<CommodoreGCRParser::Sector> *)local_28);
  std::shared_ptr<CommodoreGCRParser::Sector>::shared_ptr
            ((shared_ptr<CommodoreGCRParser::Sector> *)this,
             (shared_ptr<CommodoreGCRParser::Sector> *)local_28);
LAB_0019dfd1:
  std::shared_ptr<CommodoreGCRParser::Sector>::~shared_ptr
            ((shared_ptr<CommodoreGCRParser::Sector> *)local_28);
  sVar9.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar9.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<CommodoreGCRParser::Sector>)
         sVar9.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Sector> get_next_sector() {
			auto sector = std::make_shared<Sector>();
			const int max_index_count = index_count_ + 2;

			while(index_count_ < max_index_count) {
				// look for a sector header
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x08) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				// get sector details, skip if this looks malformed
				uint8_t checksum = uint8_t(get_next_byte());
				sector->sector = uint8_t(get_next_byte());
				sector->track = uint8_t(get_next_byte());
				uint8_t disk_id[2];
				disk_id[0] = uint8_t(get_next_byte());
				disk_id[1] = uint8_t(get_next_byte());
				if(checksum != (sector->sector ^ sector->track ^ disk_id[0] ^ disk_id[1])) continue;

				// look for the following data
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x07) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				checksum = 0;
				for(std::size_t c = 0; c < 256; c++) {
					sector->data[c] = uint8_t(get_next_byte());
					checksum ^= sector->data[c];
				}

				if(checksum == get_next_byte()) {
					uint16_t sector_address = uint16_t((sector->track << 8) | sector->sector);
					sector_cache_[sector_address] = sector;
					return sector;
				}
			}

			return nullptr;
		}